

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O1

void __thiscall cppcms::impl::url_rewriter::rule::rule(rule *this,string *r,string *pat,bool fin)

{
  iterator __position;
  pointer pbVar1;
  int iVar2;
  long lVar3;
  size_type *psVar4;
  runtime_error *this_00;
  size_t sVar5;
  bool bVar6;
  string subpat;
  value_type local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar6 = false;
  booster::regex::regex(&this->expression,(string *)r,0);
  (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->pattern).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->pattern).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pattern).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->final = fin;
  do {
    lVar3 = std::__cxx11::string::find((char)pat,0x24);
    std::__cxx11::string::substr((ulong)&local_70,(ulong)pat);
    if (bVar6) {
      std::__cxx11::string::_M_append
                ((char *)((this->pattern).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -1),
                 (ulong)local_70._M_dataplus._M_p);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->pattern,&local_70);
    }
    if (lVar3 != -1) {
      if (pat->_M_string_length <= lVar3 + 1U) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::operator+(&local_50,"Invalid rewrite pattern :",pat);
        booster::runtime_error::runtime_error(this_00,&local_50);
        *(undefined ***)this_00 = &PTR__runtime_error_00109c58;
        (this_00->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00109c80;
        __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
      }
      iVar2 = (int)(pat->_M_dataplus)._M_p[lVar3 + 1];
      if (iVar2 == 0x24) {
        bVar6 = true;
        std::__cxx11::string::push_back
                  ((char)(this->pattern).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -0x20);
      }
      else {
        local_50._M_dataplus._M_p._0_4_ = iVar2 + -0x30;
        __position._M_current =
             (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&this->index,__position,(int *)&local_50);
        }
        else {
          *__position._M_current = (int)local_50._M_dataplus._M_p;
          (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        bVar6 = false;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  } while (lVar3 != -1);
  this->pattern_size = 0;
  pbVar1 = (this->pattern).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->pattern).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar3 != 0) {
    sVar5 = this->pattern_size;
    lVar3 = lVar3 >> 5;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    psVar4 = &pbVar1->_M_string_length;
    do {
      sVar5 = sVar5 + *psVar4;
      psVar4 = psVar4 + 4;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    this->pattern_size = sVar5;
  }
  return;
}

Assistant:

rule(std::string const &r,std::string const &pat,bool fin=true) :
			expression(r),
			final(fin)
		{
			size_t pos = 0;
			bool append = false;
			for(;;){
				size_t start = pos;
				pos = pat.find('$',pos);
				std::string subpat = pat.substr(start,pos-start);
				if(append)
					pattern.back().append(subpat);
				else
					pattern.push_back(subpat);
				if(pos==std::string::npos) 
					break;
				pos++;
				char c;
				if(pos >= pat.size() || ((c=pat[pos++])!='$' && c < '0' && '9' < c)) 
					throw cppcms_error("Invalid rewrite pattern :" + pat);
				if(c=='$') {
					pattern.back()+='$';
					append=true;
				}
				else {
					index.push_back(c-'0');
					append=false;
				}

			}
			pattern_size = 0;
			for(size_t i=0;i<pattern.size();i++)
				pattern_size+=pattern[i].size();
		}